

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::IsClassMethod(Var instance)

{
  bool bVar1;
  FunctionInfo *this;
  undefined1 local_29;
  undefined8 local_28;
  JavascriptFunction *function;
  Var instance_local;
  
  bVar1 = VarIs<Js::JavascriptFunction>(instance);
  if (bVar1) {
    local_28 = UnsafeVarTo<Js::JavascriptFunction>(instance);
  }
  else {
    local_28 = (JavascriptFunction *)0x0;
  }
  local_29 = false;
  if (local_28 != (JavascriptFunction *)0x0) {
    this = JavascriptFunction::GetFunctionInfo(local_28);
    local_29 = FunctionInfo::IsClassMethod(this);
  }
  return (BOOL)local_29;
}

Assistant:

BOOL JavascriptOperators::IsClassMethod(Var instance)
    {
        JavascriptFunction * function = JavascriptOperators::TryFromVar<JavascriptFunction>(instance);
        return function && function->GetFunctionInfo()->IsClassMethod();
    }